

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O3

void __thiscall higan::HttpServer::OnMessageSendOver(HttpServer *this,TcpConnectionPtr *connection)

{
  TcpConnection *pTVar1;
  bool bVar2;
  any *__any;
  undefined8 *puVar3;
  ssize_t sVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined1 local_50 [8];
  FileContextPtr file_ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       &local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"HttpFileContext","");
  __any = TcpConnection::GetContext
                    (pTVar1,(string *)
                            &file_ptr.
                             super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
  puVar3 = (undefined8 *)std::__any_caster<std::shared_ptr<higan::FileContext>>(__any);
  local_50 = (undefined1  [8])*puVar3;
  file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar3[1];
  if (file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->sum_read_from_cache_ =
           (int)(file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->sum_read_from_cache_ + 1;
      UNLOCK();
    }
    else {
      *(int *)&(file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->sum_read_from_cache_ =
           (int)(file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->sum_read_from_cache_ + 1;
    }
  }
  this_00 = file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != &local_30) {
    operator_delete(file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,(long)local_30._vptr__Sp_counted_base + 1);
  }
  sVar4 = SendFileInternal((HttpServer *)this_00._M_pi,connection,(FileContextPtr *)local_50);
  if (0 < sVar4) {
    TcpConnection::SetCallSendOverCallback
              ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,true);
    goto LAB_00119e90;
  }
  if (sVar4 != -1) {
    if (sVar4 != 0) goto LAB_00119e90;
    TcpConnection::SetCallSendOverCallback
              ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,false);
    pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         &local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,"HttpFileContext","");
    TcpConnection::DeleteContext
              (pTVar1,(string *)
                      &file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    if (file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != &local_30) {
      operator_delete(file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,(long)local_30._vptr__Sp_counted_base + 1);
    }
    bVar2 = FileContext::CloseConnection((FileContext *)local_50);
    if (!bVar2) goto LAB_00119e90;
  }
  TcpConnection::DestroyConnection
            ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
LAB_00119e90:
  if (file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void HttpServer::OnMessageSendOver(const TcpConnectionPtr& connection)
{
	/**
	 * 如果存在相关上下文 说明文件未发送完毕 继续发送
	 */
	FileContext::FileContextPtr file_ptr = *std::any_cast<FileContext::FileContextPtr>(
			connection->GetContext("HttpFileContext"));

	ssize_t send_size = SendFileInternal(connection, file_ptr);

	if (send_size > 0)
	{
		connection->SetCallSendOverCallback(true);
	}
	else if (send_size == 0)
	{
		connection->SetCallSendOverCallback(false);
		connection->DeleteContext("HttpFileContext");

		if (file_ptr->CloseConnection())
		{
			connection->DestroyConnection();
		}
	}
	else if (send_size == -1)
	{
		connection->DestroyConnection();
	}
}